

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O1

void __thiscall DCeiling::PlayCeilingSound(DCeiling *this)

{
  sector_t_conflict *sec;
  char *seqname;
  FName local_4;
  
  sec = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
  if ((sec->Flags & 0x40) == 0) {
    if (-1 < sec->seqType) {
      SN_StartSequence((sector_t *)sec,2,(int)sec->seqType,SEQ_PLATFORM,0,false);
      return;
    }
    if ((sec->SeqName).super_FName.Index == 0) {
      if (this->m_Silent == 1) {
        seqname = "CeilingSemiSilent";
      }
      else if (this->m_Silent == 2) {
        seqname = "Silence";
      }
      else {
        seqname = "CeilingNormal";
      }
      SN_StartSequence((sector_t *)sec,2,seqname,0);
      return;
    }
    SN_StartSequence((sector_t *)sec,2,&local_4,0);
  }
  return;
}

Assistant:

void DCeiling::PlayCeilingSound ()
{
	if (m_Sector->Flags & SECF_SILENTMOVE) return;
	if (m_Sector->seqType >= 0)
	{
		SN_StartSequence (m_Sector, CHAN_CEILING, m_Sector->seqType, SEQ_PLATFORM, 0, false);
	}
	else if (m_Sector->SeqName != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_CEILING, m_Sector->SeqName, 0);
	}
	else
	{
		if (m_Silent == 2)
			SN_StartSequence (m_Sector, CHAN_CEILING, "Silence", 0);
		else if (m_Silent == 1)
			SN_StartSequence (m_Sector, CHAN_CEILING, "CeilingSemiSilent", 0);
		else
			SN_StartSequence (m_Sector, CHAN_CEILING, "CeilingNormal", 0);
	}
}